

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

Sim * __thiscall r_exec::Pred::get_simulation(Pred *this,Controller *root)

{
  bool bVar1;
  reference p;
  Sim *pSVar2;
  P<r_exec::Sim> local_40;
  P<r_exec::Sim> simulation;
  const_iterator __end1;
  const_iterator __begin1;
  vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_> *__range1;
  Controller *root_local;
  Pred *this_local;
  
  __end1 = std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>::begin
                     (&this->simulations);
  simulation.object =
       (_Object *)
       std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>::end
                 (&this->simulations);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_core::P<r_exec::Sim>_*,_std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>_>
                                *)&simulation);
    if (!bVar1) {
      return (Sim *)0x0;
    }
    p = __gnu_cxx::
        __normal_iterator<const_core::P<r_exec::Sim>_*,_std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>_>
        ::operator*(&__end1);
    core::P<r_exec::Sim>::P(&local_40,p);
    pSVar2 = core::P<r_exec::Sim>::operator->(&local_40);
    bVar1 = core::P<r_exec::Controller>::operator==(&pSVar2->root,root);
    if (bVar1) {
      this_local = (Pred *)core::P::operator_cast_to_Sim_((P *)&local_40);
    }
    core::P<r_exec::Sim>::~P(&local_40);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_core::P<r_exec::Sim>_*,_std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>_>
    ::operator++(&__end1);
  }
  return (Sim *)this_local;
}

Assistant:

Sim *Pred::get_simulation(Controller *root) const
{
    for (P<Sim> simulation : simulations) {
        if (simulation->root == root) {
            return simulation;
        }
    }

    return nullptr;
}